

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

string_view __thiscall absl::lts_20240722::Cord::FlattenSlowPath(Cord *this)

{
  RefcountAndFlags *pRVar1;
  uint uVar2;
  cord_internal *this_00;
  CordRep *pCVar3;
  CordzUpdateScope CVar4;
  CordRep *pCVar5;
  uint8_t *dst;
  Nonnull<CordRepExternal_*> in_RCX;
  string_view sVar6;
  string_view data;
  CordzUpdateScope scope;
  CordzUpdateScope local_28;
  
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    __assert_fail("contents_.is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.cc"
                  ,0x55d,"absl::string_view absl::Cord::FlattenSlowPath()");
  }
  this_00 = (cord_internal *)((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
  if (this_00 < (cord_internal *)0xff4) {
    pCVar5 = &cord_internal::CordRepFlat::NewImpl<4096ul>((size_t)this_00)->super_CordRep;
    ((CordRep *)&pCVar5->length)->length = (size_t)this_00;
    if ((pCVar5->tag - 0xf9 < 7) || (pCVar5->tag < 6)) {
      __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                    ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
    }
    dst = pCVar5->storage;
    CopyToArraySlowPath(this,(Nonnull<char_*>)dst);
  }
  else {
    if ((long)this_00 < 0) {
      std::__throw_bad_alloc();
    }
    dst = (uint8_t *)operator_new((ulong)this_00);
    CopyToArraySlowPath(this,(Nonnull<char_*>)dst);
    pCVar5 = (CordRep *)operator_new(0x20);
    (pCVar5->refcount).count_.super___atomic_base<int>._M_i = 2;
    *(code **)&pCVar5[1].refcount.count_ =
         cord_internal::
         CordRepExternalImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.cc:1389:52)>
         ::Release;
    data._M_str = (char *)pCVar5;
    data._M_len = (size_t)dst;
    cord_internal::InitializeCordRepExternal(this_00,data,in_RCX);
  }
  local_28.info_ = cord_internal::InlineData::cordz_info((InlineData *)this);
  if (local_28.info_ != (CordzInfo *)0x0) {
    absl::lts_20240722::cord_internal::CordzInfo::Lock((MethodIdentifier)local_28.info_);
  }
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
    pCVar3 = (this->contents_).data_.rep_.field_0.as_tree.rep;
    if (pCVar3 == (CordRep *)0x0) {
      __assert_fail("rep != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x376,"static void absl::cord_internal::CordRep::Unref(CordRep *)");
    }
    LOCK();
    pRVar1 = &pCVar3->refcount;
    uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar2 & 1) != 0 || 0 < (int)uVar2) {
      if (uVar2 == 2) {
        absl::lts_20240722::cord_internal::CordRep::Destroy(pCVar3);
      }
      CVar4.info_ = local_28.info_;
      if (((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
        (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar5;
        if (local_28.info_ != (CordzInfo *)0x0) {
          absl::lts_20240722::Mutex::AssertHeld();
          *(CordRep **)(CVar4.info_ + 0x40) = pCVar5;
        }
        cord_internal::CordzUpdateScope::~CordzUpdateScope(&local_28);
        sVar6._M_str = (char *)dst;
        sVar6._M_len = (size_t)this_00;
        return sVar6;
      }
      __assert_fail("data_.is_tree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                    ,0x501,
                    "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                   );
    }
    __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0xaa,"bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()")
    ;
  }
  __assert_fail("data_.is_tree()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                ,0x4d5,
                "absl::Nonnull<absl::cord_internal::CordRep *> absl::Cord::InlineRep::as_tree() const"
               );
}

Assistant:

absl::string_view Cord::FlattenSlowPath() {
  assert(contents_.is_tree());
  size_t total_size = size();
  CordRep* new_rep;
  char* new_buffer;

  // Try to put the contents into a new flat rep. If they won't fit in the
  // biggest possible flat node, use an external rep instead.
  if (total_size <= kMaxFlatLength) {
    new_rep = CordRepFlat::New(total_size);
    new_rep->length = total_size;
    new_buffer = new_rep->flat()->Data();
    CopyToArraySlowPath(new_buffer);
  } else {
    new_buffer = std::allocator<char>().allocate(total_size);
    CopyToArraySlowPath(new_buffer);
    new_rep = absl::cord_internal::NewExternalRep(
        absl::string_view(new_buffer, total_size), [](absl::string_view s) {
          std::allocator<char>().deallocate(const_cast<char*>(s.data()),
                                            s.size());
        });
  }
  CordzUpdateScope scope(contents_.cordz_info(), CordzUpdateTracker::kFlatten);
  CordRep::Unref(contents_.as_tree());
  contents_.SetTree(new_rep, scope);
  return absl::string_view(new_buffer, total_size);
}